

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void matras_touch_reserve_test(void)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int local_fc;
  int j_1;
  size_t extents_in_use_after_reserve_1;
  int local_e8;
  int touch_count_1;
  int i_2;
  int j;
  size_t extents_in_use_after_reserve;
  int touch_count;
  int i_1;
  matras_view view;
  void *data;
  size_t i;
  matras_view empty_view;
  matras mat;
  matras_id_t id;
  size_t max_capacity;
  size_t extents_in_use_before_reserve;
  int random_test_count;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_touch_reserve_test");
  plan(0xe);
  matras_create((matras *)&empty_view.next_view,0x10,&pta_allocator,(matras_stats *)0x0);
  matras_create_read_view((matras *)&empty_view.next_view,(matras_view *)&i);
  data = (void *)0x0;
  while( true ) {
    if ((void *)0xff < data) {
      pvVar4 = matras_alloc((matras *)&empty_view.next_view,(matras_id_t *)((long)&mat.stats + 4));
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x195
          ,"line %d");
      _ok((uint)(mat.stats._4_4_ == 0xff),"id == max_capacity - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x196
          ,"line %d");
      sVar1 = AllocatedCount;
      matras_touch_reserve((matras *)&empty_view.next_view,0);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19b
          ,"line %d");
      matras_touch_reserve((matras *)&empty_view.next_view,1);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19d
          ,"line %d");
      matras_touch_reserve((matras *)&empty_view.next_view,0x80);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19f
          ,"line %d");
      matras_touch_reserve((matras *)&empty_view.next_view,0x100);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a1
          ,"line %d");
      matras_destroy_read_view((matras *)&empty_view.next_view,(matras_view *)&i);
      sVar1 = AllocatedCount;
      matras_touch_reserve((matras *)&empty_view.next_view,0);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a7
          ,"line %d");
      matras_touch_reserve((matras *)&empty_view.next_view,1);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a9
          ,"line %d");
      matras_touch_reserve((matras *)&empty_view.next_view,0x80);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ab
          ,"line %d");
      matras_touch_reserve((matras *)&empty_view.next_view,0x100);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ad
          ,"line %d");
      matras_create_read_view((matras *)&empty_view.next_view,(matras_view *)&touch_count);
      sVar1 = AllocatedCount;
      matras_touch_reserve((matras *)&empty_view.next_view,2);
      _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1b6
          ,"line %d");
      matras_touch((matras *)&empty_view.next_view,0);
      matras_touch((matras *)&empty_view.next_view,mat.stats._4_4_);
      _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ba
          ,"line %d");
      matras_destroy_read_view((matras *)&empty_view.next_view,(matras_view *)&touch_count);
      matras_create_read_view((matras *)&empty_view.next_view,(matras_view *)&touch_count);
      matras_touch((matras *)&empty_view.next_view,mat.stats._4_4_ >> 1);
      sVar1 = AllocatedCount;
      matras_touch_reserve((matras *)&empty_view.next_view,2);
      _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1c7
          ,"line %d");
      matras_touch((matras *)&empty_view.next_view,0);
      matras_touch((matras *)&empty_view.next_view,mat.stats._4_4_);
      _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1cb
          ,"line %d");
      extents_in_use_after_reserve._4_4_ = 0;
      while( true ) {
        if (9999 < extents_in_use_after_reserve._4_4_) {
          local_e8 = 0;
          while( true ) {
            if (9999 < local_e8) {
              matras_destroy_read_view((matras *)&empty_view.next_view,(matras_view *)&touch_count);
              matras_destroy((matras *)&empty_view.next_view);
              _space(_stdout);
              printf("# *** %s: done ***\n","matras_touch_reserve_test");
              check_plan();
              return;
            }
            matras_destroy_read_view((matras *)&empty_view.next_view,(matras_view *)&touch_count);
            matras_create_read_view((matras *)&empty_view.next_view,(matras_view *)&touch_count);
            iVar2 = rand();
            iVar2 = (int)((ulong)(long)iVar2 % 0x100);
            matras_touch_reserve((matras *)&empty_view.next_view,iVar2);
            sVar1 = AllocatedCount;
            for (local_fc = 0; local_fc < iVar2; local_fc = local_fc + 1) {
              iVar3 = rand();
              matras_touch((matras *)&empty_view.next_view,(matras_id_t)((ulong)(long)iVar3 % 0x100)
                          );
            }
            if (AllocatedCount != sVar1) break;
            local_e8 = local_e8 + 1;
          }
          fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                  "AllocatedCount == extents_in_use_after_reserve","false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                  ,0x1e4,"matras_touch_reserve_test");
          exit(-1);
        }
        iVar2 = rand();
        iVar2 = (int)((ulong)(long)iVar2 % 0x100);
        matras_touch_reserve((matras *)&empty_view.next_view,iVar2);
        sVar1 = AllocatedCount;
        for (touch_count_1 = 0; touch_count_1 < iVar2; touch_count_1 = touch_count_1 + 1) {
          iVar3 = rand();
          matras_touch((matras *)&empty_view.next_view,(matras_id_t)((ulong)(long)iVar3 % 0x100));
        }
        if (AllocatedCount != sVar1) break;
        extents_in_use_after_reserve._4_4_ = extents_in_use_after_reserve._4_4_ + 1;
      }
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
              "AllocatedCount == extents_in_use_after_reserve","false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              0x1d5,"matras_touch_reserve_test");
      exit(-1);
    }
    view.next_view =
         (matras_view *)
         matras_alloc((matras *)&empty_view.next_view,(matras_id_t *)((long)&mat.stats + 4));
    if (view.next_view == (matras_view *)0x0) break;
    if ((void *)(ulong)mat.stats._4_4_ != data) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","id == i","false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              0x193,"matras_touch_reserve_test");
      exit(-1);
    }
    data = (void *)((long)data + 1);
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","data != NULL","false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x192
          ,"matras_touch_reserve_test");
  exit(-1);
}

Assistant:

void
matras_touch_reserve_test()
{
	header();
	plan(14);

	int random_test_count = 10000;
	size_t extents_in_use_before_reserve;

	size_t max_capacity = PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);

	matras_id_t id;
	struct matras mat;
	matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);

	/* Create an empty matras view. */
	struct matras_view empty_view;
	matras_create_read_view(&mat, &empty_view);

	/* Fill the actual matras. */
	for (size_t i = 0; i < max_capacity; i++) {
		void *data = matras_alloc(&mat, &id);
		fail_unless(data != NULL);
		fail_unless(id == i);
	}
	is(matras_alloc(&mat, &id), NULL);
	is(id, max_capacity - 1);

	/* Nothing reserved with an empty view. */
	extents_in_use_before_reserve = AllocatedCount;
	matras_touch_reserve(&mat, 0);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, 1);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, max_capacity / 2);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, max_capacity);
	is(AllocatedCount, extents_in_use_before_reserve);

	/* Nothing reserved with no view. */
	matras_destroy_read_view(&mat, &empty_view);
	extents_in_use_before_reserve = AllocatedCount;
	matras_touch_reserve(&mat, 0);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, 1);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, max_capacity / 2);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, max_capacity);
	is(AllocatedCount, extents_in_use_before_reserve);

	/* Create a filled read view. */
	struct matras_view view;
	matras_create_read_view(&mat, &view);

	/* Reserve and touch first and last blocks. */
	extents_in_use_before_reserve = AllocatedCount;
	matras_touch_reserve(&mat, 2);
	is(AllocatedCount, extents_in_use_before_reserve + 5);
	matras_touch(&mat, 0);
	matras_touch(&mat, id);
	/* Used reserved blocks, no new allocations. */
	is(AllocatedCount, extents_in_use_before_reserve + 5);

	/* Recreate the read view. */
	matras_destroy_read_view(&mat, &view);
	matras_create_read_view(&mat, &view);

	/*
	 * Reserve and touch first and last
	 * blocks after the root is copied.
	 */
	matras_touch(&mat, id / 2);
	extents_in_use_before_reserve = AllocatedCount;
	matras_touch_reserve(&mat, 2);
	is(AllocatedCount, extents_in_use_before_reserve + 4);
	matras_touch(&mat, 0);
	matras_touch(&mat, id);
	/* Used reserved blocks, no new allocations. */
	is(AllocatedCount, extents_in_use_before_reserve + 4);

	/* Reserve and touch random blocks. */
	for (int i = 0; i < random_test_count; i++) {
		int touch_count = rand() % max_capacity;
		matras_touch_reserve(&mat, touch_count);
		size_t extents_in_use_after_reserve = AllocatedCount;
		for (int j = 0; j < touch_count; j++)
			matras_touch(&mat, rand() % max_capacity);
		/* Used reserved blocks, no new allocations. */
		fail_unless(AllocatedCount == extents_in_use_after_reserve);
	}

	/* Reserve and touch random blocks with new read view. */
	for (int i = 0; i < random_test_count; i++) {
		/* Recreate the read view. */
		matras_destroy_read_view(&mat, &view);
		matras_create_read_view(&mat, &view);

		int touch_count = rand() % max_capacity;
		matras_touch_reserve(&mat, touch_count);
		size_t extents_in_use_after_reserve = AllocatedCount;
		for (int j = 0; j < touch_count; j++)
			matras_touch(&mat, rand() % max_capacity);
		/* Used reserved blocks, no new allocations. */
		fail_unless(AllocatedCount == extents_in_use_after_reserve);
	}

	/* Clean-up. */
	matras_destroy_read_view(&mat, &view);
	matras_destroy(&mat);

	footer();
	check_plan();
}